

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testArithmetic.cpp
# Opt level: O2

void testArithmetic(void)

{
  float fVar1;
  uint __line;
  half hVar2;
  undefined4 in_EAX;
  ostream *poVar3;
  ulong uVar4;
  char *__assertion;
  undefined4 uStack_18;
  half h2;
  half h1;
  
  uStack_18 = in_EAX;
  std::operator<<((ostream *)&std::cout,"basic arithmetic operations:\n");
  _uStack_18 = CONCAT24(0x4400,uStack_18);
  _uStack_18 = CONCAT26(0x4200,_uStack_18);
  std::operator<<((ostream *)&std::cout,"f1 = ");
  poVar3 = std::ostream::_M_insert<double>(1.0);
  std::operator<<(poVar3,", f2 = ");
  poVar3 = std::ostream::_M_insert<double>(2.0);
  poVar3 = std::operator<<(poVar3,", h1 = ");
  poVar3 = (ostream *)operator<<(poVar3,(half)0x4200);
  poVar3 = std::operator<<(poVar3,", h2 = ");
  poVar3 = (ostream *)operator<<(poVar3,(half)0x4400);
  std::endl<char,std::char_traits<char>>(poVar3);
  Imath_3_2::half::operator=(&h1,3.0);
  fVar1 = *(float *)(_imath_half_to_float_table + (_uStack_18 >> 0x30) * 4);
  if ((fVar1 != 3.0) || (NAN(fVar1))) {
    __assertion = "h1 == 3";
    __line = 0x27;
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"h1 = f1 + f2: ");
    poVar3 = (ostream *)operator<<(poVar3,(half)h1._h);
    std::endl<char,std::char_traits<char>>(poVar3);
    Imath_3_2::half::operator+=(&h2,1.0);
    fVar1 = *(float *)(_imath_half_to_float_table + (_uStack_18 >> 0x20 & 0xffff) * 4);
    if ((fVar1 != 5.0) || (NAN(fVar1))) {
      __assertion = "h2 == 5";
      __line = 0x2c;
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,"h2 += f1: ");
      poVar3 = (ostream *)operator<<(poVar3,(half)h2._h);
      std::endl<char,std::char_traits<char>>(poVar3);
      Imath_3_2::half::operator=
                (&h2,*(float *)(_imath_half_to_float_table + (_uStack_18 >> 0x30) * 4) +
                     *(float *)(_imath_half_to_float_table + (_uStack_18 >> 0x20 & 0xffff) * 4));
      fVar1 = *(float *)(_imath_half_to_float_table + (_uStack_18 >> 0x20 & 0xffff) * 4);
      if ((fVar1 != 8.0) || (NAN(fVar1))) {
        __assertion = "h2 == 8";
        __line = 0x31;
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,"h2 = h1 + h2: ");
        poVar3 = (ostream *)operator<<(poVar3,(half)h2._h);
        std::endl<char,std::char_traits<char>>(poVar3);
        Imath_3_2::half::operator+=(&h2,(half)h1._h);
        fVar1 = *(float *)(_imath_half_to_float_table + (_uStack_18 >> 0x20 & 0xffff) * 4);
        if ((fVar1 != 11.0) || (NAN(fVar1))) {
          __assertion = "h2 == 11";
          __line = 0x36;
        }
        else {
          poVar3 = std::operator<<((ostream *)&std::cout,"h2 += h1: ");
          poVar3 = (ostream *)operator<<(poVar3,(half)h2._h);
          std::endl<char,std::char_traits<char>>(poVar3);
          hVar2._h = h2._h;
          uVar4 = (ulong)h2._h;
          _uStack_18 = CONCAT26(hVar2._h,_uStack_18);
          fVar1 = *(float *)(_imath_half_to_float_table + uVar4 * 4);
          if ((fVar1 != 11.0) || (NAN(fVar1))) {
            __assertion = "h1 == 11";
            __line = 0x3b;
          }
          else {
            poVar3 = std::operator<<((ostream *)&std::cout,"h1 = h2: ");
            poVar3 = (ostream *)operator<<(poVar3,(half)h1._h);
            std::endl<char,std::char_traits<char>>(poVar3);
            _uStack_18 = CONCAT24((short)((ulong)h1._h ^ 0x8000),uStack_18);
            fVar1 = *(float *)(_imath_half_to_float_table + ((ulong)h1._h ^ 0x8000) * 4);
            if ((fVar1 == -11.0) && (!NAN(fVar1))) {
              poVar3 = std::operator<<((ostream *)&std::cout,"h2 = -h1: ");
              poVar3 = (ostream *)operator<<(poVar3,(half)h2._h);
              std::endl<char,std::char_traits<char>>(poVar3);
              std::operator<<((ostream *)&std::cout,"ok\n\n");
              std::ostream::flush();
              return;
            }
            __assertion = "h2 == -11";
            __line = 0x40;
          }
        }
      }
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testArithmetic.cpp"
                ,__line,"void testArithmetic()");
}

Assistant:

void
testArithmetic ()
{
    cout << "basic arithmetic operations:\n";

    float f1 (1);
    float f2 (2);
    half  h1 (3);
    half  h2 (4);

    cout << "f1 = " << f1
         << ", "
            "f2 = "
         << f2
         << ", "
            "h1 = "
         << h1
         << ", "
            "h2 = "
         << h2 << endl;

    h1 = f1 + f2;
    assert (h1 == 3);

    cout << "h1 = f1 + f2: " << h1 << endl;

    h2 += f1;
    assert (h2 == 5);

    cout << "h2 += f1: " << h2 << endl;

    h2 = h1 + h2;
    assert (h2 == 8);

    cout << "h2 = h1 + h2: " << h2 << endl;

    h2 += h1;
    assert (h2 == 11);

    cout << "h2 += h1: " << h2 << endl;

    h1 = h2;
    assert (h1 == 11);

    cout << "h1 = h2: " << h1 << endl;

    h2 = -h1;
    assert (h2 == -11);

    cout << "h2 = -h1: " << h2 << endl;

    cout << "ok\n\n" << flush;
}